

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_integer_value(string *str)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int i;
  long lVar4;
  
  if (str->_M_string_length == 0) {
    return false;
  }
  bVar3 = str_utils::is_numeric(*(str->_M_dataplus)._M_p);
  if (((bVar3) || (cVar1 = *(str->_M_dataplus)._M_p, cVar1 == '-')) || (cVar1 == '+')) {
    lVar4 = 1;
    do {
      pcVar2 = (str->_M_dataplus)._M_p;
      if ((int)str->_M_string_length <= lVar4) {
        bVar3 = str_utils::is_numeric(*pcVar2);
        if (bVar3) {
          return true;
        }
        return 1 < str->_M_string_length;
      }
      bVar3 = str_utils::is_numeric(pcVar2[lVar4]);
      lVar4 = lVar4 + 1;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool Grammar::is_integer_value(const std::string& str) {
    if (str.size() == 0)
        return false;
    if (!str_utils::is_numeric(str[0]) && str[0] != '+' && str[0] != '-')
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_numeric(str[i]))
            return false;
    return str_utils::is_numeric(str[0]) || str.size() > 1;
}